

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O2

bool __thiscall
despot::NoisyLaserTag::Step
          (NoisyLaserTag *this,State *state,double random_num,ACT_TYPE action,double *reward,
          OBS_TYPE *obs)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  OBS_TYPE OVar6;
  OBS_TYPE OVar7;
  OBS_TYPE reading;
  int dir;
  OBS_TYPE dir_00;
  double dVar8;
  double dVar9;
  Random random;
  
  despot::Random::Random(&random,random_num);
  dVar8 = (double)despot::Random::NextDouble();
  bVar5 = BaseTag::Step(&this->super_BaseTag,state,dVar8,action,reward);
  if ((bVar5) ||
     (iVar1 = *(int *)(state + 0xc),
     (this->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start[iVar1] ==
     (this->super_BaseTag).opp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start[iVar1])) {
    *obs = (this->super_BaseTag).same_loc_obs_;
  }
  else {
    pvVar2 = (this->reading_distributions_).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *obs = 0;
    dVar8 = Globals::TINY;
    for (dir_00 = 0; (long)dir_00 < (long)NBEAMS; dir_00 = dir_00 + 1) {
      dVar9 = (double)despot::Random::NextDouble();
      lVar3 = *(long *)&pvVar2[iVar1].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar4 = *(long *)(lVar3 + dir_00 * 0x18);
      OVar6 = *(long *)(lVar3 + 8 + dir_00 * 0x18) - lVar4 >> 3;
      OVar7 = 0xffffffffffffffff;
      do {
        reading = OVar6;
        if (OVar7 - OVar6 == -1) break;
        dVar9 = dVar9 - *(double *)(lVar4 + 8 + OVar7 * 8);
        reading = OVar7 + 1;
        OVar7 = reading;
      } while (dVar8 <= dVar9);
      SetReading(obs,reading,dir_00);
    }
  }
  return bVar5;
}

Assistant:

bool NoisyLaserTag::Step(State& state, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	Random random(random_num);
	bool terminal = BaseTag::Step(state, random.NextDouble(), action, reward);

	if (terminal) {
		obs = same_loc_obs_;
	} else {
		if (rob_[state.state_id] == opp_[state.state_id])
			obs = same_loc_obs_;
		else {
			const vector<vector<double> >& distribution = reading_distributions_[state.state_id];

			obs = 0;
			for (int dir = 0; dir < NBEAMS; dir++) {
				double mass = random.NextDouble();
				int reading = 0;
				for (; reading < distribution[dir].size(); reading++) {
					mass -= distribution[dir][reading];
					if (mass < Globals::TINY)
						break;
				}
				SetReading(obs, reading, dir);
			}
		}
	}

	return terminal;
}